

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitRefTest(OptimizeInstructions *this,RefTest *curr)

{
  bool bVar1;
  EvaluationResult EVar2;
  Module *wasm;
  Block *pBVar3;
  Drop *left;
  Const *right;
  RefIsNull *pRVar4;
  Unary *rep;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  bool local_f1;
  optional<wasm::Type> local_e0;
  BasicType local_cc;
  optional<wasm::Type> local_c8;
  Drop *local_b8;
  Unreachable *local_b0;
  initializer_list<wasm::Expression_*> local_a8;
  optional<wasm::Type> local_90;
  Drop *local_80;
  Const *local_78;
  initializer_list<wasm::Expression_*> local_70;
  uintptr_t local_60;
  uintptr_t local_58;
  BasicType local_4c;
  uintptr_t local_48;
  uintptr_t local_40;
  Type local_38;
  Type glb;
  Type refType;
  Builder builder;
  RefTest *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)62>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  if (!bVar1) {
    wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
    Builder::Builder((Builder *)&refType,wasm);
    local_48 = (uintptr_t)getFallthroughType(this,curr->ref);
    local_40 = (curr->castType).id;
    glb.id = local_48;
    local_38 = wasm::Type::getGreatestLowerBound(local_40,(Type)local_48);
    local_4c = unreachable;
    bVar1 = wasm::Type::operator!=(&local_38,&local_4c);
    local_f1 = false;
    if (bVar1) {
      local_f1 = wasm::Type::operator!=(&local_38,&curr->castType);
    }
    if (local_f1 != false) {
      (curr->castType).id = local_38.id;
    }
    local_58 = glb.id;
    local_60 = (curr->castType).id;
    EVar2 = GCTypeUtils::evaluateCastCheck(glb,(Type)local_60);
    switch(EVar2) {
    case Unknown:
      break;
    case Success:
      local_80 = Builder::makeDrop((Builder *)&refType,curr->ref);
      local_78 = Builder::makeConst<int>((Builder *)&refType,1);
      local_70._M_array = (iterator)&local_80;
      local_70._M_len = 2;
      std::optional<wasm::Type>::optional(&local_90);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      pBVar3 = Builder::makeBlock((Builder *)&refType,&local_70,type);
      replaceCurrent(this,(Expression *)pBVar3);
      break;
    case Failure:
      left = Builder::makeDrop((Builder *)&refType,curr->ref);
      right = Builder::makeConst<int>((Builder *)&refType,0);
      std::optional<wasm::Type>::optional(&local_e0);
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_e0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_e0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      pBVar3 = Builder::makeSequence
                         ((Builder *)&refType,(Expression *)left,(Expression *)right,type_01);
      replaceCurrent(this,(Expression *)pBVar3);
      break;
    case SuccessOnlyIfNull:
      pRVar4 = Builder::makeRefIsNull((Builder *)&refType,curr->ref);
      replaceCurrent(this,(Expression *)pRVar4);
      break;
    case SuccessOnlyIfNonNull:
      pRVar4 = Builder::makeRefIsNull((Builder *)&refType,curr->ref);
      rep = Builder::makeUnary((Builder *)&refType,EqZInt32,(Expression *)pRVar4);
      replaceCurrent(this,(Expression *)rep);
      break;
    case Unreachable:
      local_b8 = Builder::makeDrop((Builder *)&refType,curr->ref);
      local_b0 = Builder::makeUnreachable((Builder *)&refType);
      local_a8._M_array = (iterator)&local_b8;
      local_a8._M_len = 2;
      local_cc = i32;
      std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>(&local_c8,&local_cc);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      pBVar3 = Builder::makeBlock((Builder *)&refType,&local_a8,type_00);
      replaceCurrent(this,(Expression *)pBVar3);
    }
  }
  return;
}

Assistant:

void visitRefTest(RefTest* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    Builder builder(*getModule());

    // Parallel to the code in visitRefCast: we look not just at the final type
    // we are given, but at fallthrough values as well.
    Type refType = getFallthroughType(curr->ref);

    // Improve the cast type as much as we can without changing the results.
    auto glb = Type::getGreatestLowerBound(curr->castType, refType);
    if (glb != Type::unreachable && glb != curr->castType) {
      curr->castType = glb;
    }

    switch (GCTypeUtils::evaluateCastCheck(refType, curr->castType)) {
      case GCTypeUtils::Unknown:
        break;
      case GCTypeUtils::Success:
        replaceCurrent(builder.makeBlock(
          {builder.makeDrop(curr->ref), builder.makeConst(int32_t(1))}));
        return;
      case GCTypeUtils::Unreachable:
        // Make sure to emit a block with the same type as us, to avoid other
        // code in this pass needing to handle unexpected unreachable code
        // (which is only properly propagated at the end of this pass when we
        // refinalize).
        replaceCurrent(builder.makeBlock(
          {builder.makeDrop(curr->ref), builder.makeUnreachable()}, Type::i32));
        return;
      case GCTypeUtils::Failure:
        replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                            builder.makeConst(int32_t(0))));
        return;
      case GCTypeUtils::SuccessOnlyIfNull:
        replaceCurrent(builder.makeRefIsNull(curr->ref));
        return;
      case GCTypeUtils::SuccessOnlyIfNonNull:
        // This adds an EqZ, but code size does not regress since ref.test
        // also encodes a type, and ref.is_null does not. The EqZ may also add
        // some work, but a cast is likely more expensive than a null check +
        // a fast int operation.
        replaceCurrent(
          builder.makeUnary(EqZInt32, builder.makeRefIsNull(curr->ref)));
        return;
    }
  }